

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.hpp
# Opt level: O3

longdouble *
chaiscript::bootstrap::parse_string<long_double>(longdouble *__return_storage_ptr__,string *i)

{
  longdouble *plVar1;
  stringstream ss;
  stringstream local_190 [128];
  ios_base local_110 [264];
  
  std::__cxx11::stringstream::stringstream(local_190,(string *)__return_storage_ptr__,_S_out|_S_in);
  std::istream::_M_extract<long_double>((longdouble *)local_190);
  std::__cxx11::stringstream::~stringstream(local_190);
  plVar1 = (longdouble *)std::ios_base::~ios_base(local_110);
  return plVar1;
}

Assistant:

Input parse_string(const std::string &i) {
    if constexpr (!std::is_same<Input, wchar_t>::value && !std::is_same<Input, char16_t>::value && !std::is_same<Input, char32_t>::value) {
      std::stringstream ss(i);
      Input t;
      ss >> t;
      return t;
    } else {
      throw std::runtime_error("Parsing of wide characters is not yet supported");
    }
  }